

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

apx_error_t apx_server_stop_thread(apx_server_t *self)

{
  int iVar1;
  pthread_t __thread1;
  int s;
  void *status;
  apx_server_t *self_local;
  
  if ((self->is_event_thread_valid & 1U) != 0) {
    status = self;
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,*(pthread_t *)((long)status + 0x130));
    if (iVar1 != 0) {
      return 0x1e;
    }
    iVar1 = pthread_join(*(pthread_t *)((long)status + 0x130),(void **)&stack0xffffffffffffffe0);
    if (iVar1 != 0) {
      return 0x1e;
    }
    *(undefined1 *)((long)status + 0x138) = 0;
  }
  return 0;
}

Assistant:

static apx_error_t apx_server_stop_thread(apx_server_t* self)
{
   if (self->is_event_thread_valid)
   {
#ifdef _MSC_VER
      DWORD result = WaitForSingleObject(self->event_thread, 5000);
      if (result == WAIT_TIMEOUT)
      {
         return APX_THREAD_JOIN_TIMEOUT_ERROR;
      }
      else if (result == WAIT_FAILED)
      {
         return APX_THREAD_JOIN_ERROR;
      }
      CloseHandle(self->event_thread);
      self->event_thread = INVALID_HANDLE_VALUE;
#else
      if(pthread_equal(pthread_self(),self->event_thread) == 0)
      {
         void *status;
         int s = pthread_join(self->event_thread, &status);
         if (s != 0)
         {
            return APX_THREAD_JOIN_ERROR;
         }
      }
      else
      {
         return APX_THREAD_JOIN_ERROR;
      }
#endif
   self->is_event_thread_valid = false;
   }
   return APX_NO_ERROR;
}